

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint codepoint)

{
  SizeType SVar1;
  Frag *pFVar2;
  
  SVar1 = NewState(this,0xffffffff,0xffffffff,codepoint);
  pFVar2 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack,1);
  pFVar2->start = SVar1;
  pFVar2->out = SVar1;
  pFVar2->minIndex = SVar1;
  return;
}

Assistant:

void PushOperand(Stack<Allocator>& operandStack, unsigned codepoint) {
        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, codepoint);
        *operandStack.template Push<Frag>() = Frag(s, s, s);
    }